

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

NodeKind __thiscall llvm::yaml::Input::getNodeKind(Input *this)

{
  bool bVar1;
  NodeKind NVar2;
  HNode **Val;
  
  Val = &this->CurrentNode;
  bVar1 = isa_impl_wrap<llvm::yaml::Input::ScalarHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
          ::doit(Val);
  if (bVar1) {
    NVar2 = Scalar;
  }
  else {
    bVar1 = isa_impl_wrap<llvm::yaml::Input::MapHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
            ::doit(Val);
    NVar2 = Map;
    if (!bVar1) {
      bVar1 = isa_impl_wrap<llvm::yaml::Input::SequenceHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
              ::doit(Val);
      NVar2 = Sequence;
      if (!bVar1) {
        llvm_unreachable_internal
                  ("Unsupported node kind",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/YAMLTraits.cpp"
                   ,0x16b);
      }
    }
  }
  return NVar2;
}

Assistant:

NodeKind Input::getNodeKind() {
  if (isa<ScalarHNode>(CurrentNode))
    return NodeKind::Scalar;
  else if (isa<MapHNode>(CurrentNode))
    return NodeKind::Map;
  else if (isa<SequenceHNode>(CurrentNode))
    return NodeKind::Sequence;
  llvm_unreachable("Unsupported node kind");
}